

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int GetLatestDataFromThreadNMEADevicex(NMEADEVICE *pNMEADevice,NMEADATA *pNMEAData)

{
  int iVar1;
  CRITICAL_SECTION *__mutex;
  long lVar2;
  NMEADATA *__src;
  
  __mutex = NMEADeviceCS;
  __src = nmeadataNMEADevice;
  lVar2 = 0;
  do {
    if ((NMEADEVICE *)addrsNMEADevice[lVar2] == pNMEADevice) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      memcpy(pNMEAData,__src,0x3d8);
      iVar1 = resNMEADevice[lVar2];
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar1;
    }
    lVar2 = lVar2 + 1;
    __mutex = __mutex + 1;
    __src = __src + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetLatestDataFromThreadNMEADevicex(NMEADEVICE* pNMEADevice, NMEADATA* pNMEAData)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsNMEADevice[id] != pNMEADevice)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&NMEADeviceCS[id]);
	*pNMEAData = nmeadataNMEADevice[id];
	res = resNMEADevice[id];
	LeaveCriticalSection(&NMEADeviceCS[id]);

	return res;
}